

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_heat_maps_test.cpp
# Opt level: O1

void __thiscall
check_distance_of_heat_maps_infinite_power_parameters::test_method
          (check_distance_of_heat_maps_infinite_power_parameters *this)

{
  double dVar1;
  double dVar2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  filter_2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  filter;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> q;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> p;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_218;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_200;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1e8;
  undefined1 local_1d0;
  undefined8 local_1c8;
  shared_count sStack_1c0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1b8;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> local_1a0;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> local_108;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  undefined **local_30;
  undefined1 local_28;
  undefined8 *local_20;
  char **local_18;
  
  Gudhi::Persistence_representations::create_Gaussian_filter(&local_1b8,100,1.0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_1e8,&local_1b8);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps
            (&local_108,"data/file_with_diagram",&local_1e8,false,1000,0.0,1.0,0xffffffff);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_1e8);
  Gudhi::Persistence_representations::create_Gaussian_filter(&local_200,0x96,1.0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_218,&local_200);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps(&local_1a0,"data/file_with_diagram",&local_218,true,1000,0.0,1.0,0xffffffff)
  ;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_218);
  dVar1 = Gudhi::Persistence_representations::
          Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
          distance(&local_108,&local_1a0,1.79769313486232e+308);
  dVar2 = Gudhi::Persistence_representations::
          Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
          distance(&local_108,&local_1a0,INFINITY);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_heat_maps_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0xd0);
  local_1d0 = dVar1 == dVar2;
  local_1c8 = 0;
  sStack_1c0.pi_ = (sp_counted_base *)0x0;
  local_18 = &local_60;
  local_60 = "distance_max_double_parameter == distance_inf_double_parameter";
  local_58 = "";
  local_28 = 0;
  local_30 = &PTR__lazy_ostream_00113d08;
  local_20 = &boost::unit_test::lazy_ostream::inst;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_heat_maps_test.cpp"
  ;
  local_68 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1c0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_1a0.heat_map);
  if (local_1a0.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a0.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1a0.interval.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.interval.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a0.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1a0.kernel.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1a0.kernel.super__Function_base._M_manager)
              ((_Any_data *)&local_1a0.kernel,(_Any_data *)&local_1a0.kernel,__destroy_functor);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_200);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_108.heat_map);
  if (local_108.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108.interval.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.interval.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108.kernel.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_108.kernel.super__Function_base._M_manager)
              ((_Any_data *)&local_108.kernel,(_Any_data *)&local_108.kernel,__destroy_functor);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_1b8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_distance_of_heat_maps_infinite_power_parameters) {
  std::vector<std::vector<double> > filter = create_Gaussian_filter(100, 1);
  Persistence_heat_maps<constant_scaling_function> p("data/file_with_diagram", filter, false, 1000, 0, 1);

  std::vector<std::vector<double> > filter_2 = create_Gaussian_filter(150, 1);
  Persistence_heat_maps<constant_scaling_function> q("data/file_with_diagram", filter_2, true, 1000, 0, 1);

  double distance_max_double_parameter = p.distance(q, std::numeric_limits<double>::max());
  double distance_inf_double_parameter = p.distance(q, std::numeric_limits<double>::infinity());

  // std::cerr << "distance_max_double_parameter: " << distance_max_double_parameter << std::endl;
  // std::cerr << "distance_inf_double_parameter: " << distance_inf_double_parameter << std::endl;

  BOOST_CHECK(distance_max_double_parameter == distance_inf_double_parameter);
}